

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O3

int c_itoa(char *buf,size_t buf_size,int64_t num,int base,int flags,int field_width)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  byte bVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  byte *pbVar7;
  byte bVar8;
  ulong uVar9;
  ulong uVar10;
  bool bVar11;
  char tmp [40];
  byte local_58 [48];
  
  pbVar7 = local_58;
  uVar6 = -num;
  if (0 < num) {
    uVar6 = num;
  }
  uVar5 = CONCAT44(0,base);
  uVar10 = 0;
  do {
    uVar9 = uVar10;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar5;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar6;
    bVar8 = SUB161(auVar2 % auVar1,0);
    bVar3 = bVar8 + 0x57;
    if (SUB168(auVar2 % auVar1,0) < 10) {
      bVar3 = bVar8 | 0x30;
    }
    local_58[uVar9] = bVar3;
    uVar10 = uVar9 + 1;
    bVar11 = uVar5 <= uVar6;
    uVar6 = uVar6 / uVar5;
  } while (bVar11);
  if ((flags == 0) || (field_width <= (int)(uint)uVar10 || 0x25 < uVar9)) {
    uVar6 = uVar10 & 0xffffffff;
  }
  else {
    uVar5 = (ulong)(~(uint)uVar10 + field_width);
    uVar6 = 0x26 - uVar10;
    if (uVar5 < 0x26 - uVar10) {
      uVar6 = uVar5;
    }
    memset(local_58 + uVar9 + 1,0x30,uVar6 + 1);
    do {
      uVar6 = uVar10 + 1;
      if (field_width <= (int)uVar10 + 1) break;
      bVar11 = uVar10 < 0x26;
      uVar10 = uVar6;
    } while (bVar11);
  }
  if (num < 0) {
    iVar4 = (int)uVar6;
    uVar6 = (ulong)(iVar4 + 1);
    local_58[iVar4] = 0x2d;
  }
  iVar4 = (int)uVar6;
  if (iVar4 < 1) {
    iVar4 = 0;
  }
  else {
    uVar10 = 0;
    do {
      pbVar7 = pbVar7 + -1;
      if ((long)uVar10 < (long)(int)buf_size) {
        buf[uVar10] = pbVar7[uVar6 & 0xffffffff];
      }
      uVar10 = uVar10 + 1;
    } while ((uVar6 & 0xffffffff) != uVar10);
  }
  return iVar4;
}

Assistant:

static int c_itoa(char *buf, size_t buf_size, int64_t num, int base, int flags,
                  int field_width) {
    char tmp[40];
    int i = 0, k = 0, neg = 0;

    if (num < 0) {
        neg++;
        num = -num;
    }

    /* Print into temporary buffer - in reverse order */
    do {
        int rem = num % base;
        if (rem < 10) {
            tmp[k++] = '0' + rem;
        } else {
            tmp[k++] = 'a' + (rem - 10);
        }
        num /= base;
    } while (num > 0);

    /* Zero padding */
    if (flags && C_SNPRINTF_FLAG_ZERO) {
        while (k < field_width && k < (int) sizeof(tmp) - 1) {
            tmp[k++] = '0';
        }
    }

    /* And sign */
    if (neg) {
        tmp[k++] = '-';
    }

    /* Now output */
    while (--k >= 0) {
        C_SNPRINTF_APPEND_CHAR(tmp[k]);
    }

    return i;
}